

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread_test.cc
# Opt level: O0

void anon_unknown.dwarf_3e00dc::compare_fp_stats_md5(aom_fixed_buf_t *fp_stats)

{
  bool bVar1;
  AssertHelper *this;
  uchar *md;
  size_t in_RDX;
  size_t n;
  uchar *in_RSI;
  long *in_RDI;
  AssertionResult gtest_ar;
  char *md5_row_mt_1_str;
  char *md5_row_mt_0_str;
  MD5 md5_row_mt_1;
  MD5 md5_row_mt_0;
  uint8_t *stats2;
  uint8_t *stats1;
  char (*in_stack_fffffffffffffe98) [26];
  MD5 *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffec0;
  Type in_stack_fffffffffffffecc;
  AssertHelper *in_stack_fffffffffffffed0;
  char *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  MD5 *in_stack_ffffffffffffff10;
  Message *in_stack_ffffffffffffff18;
  AssertHelper *in_stack_ffffffffffffff20;
  MD5 local_94;
  uchar *local_18;
  long local_10;
  
  local_10 = *in_RDI;
  md = (uchar *)((ulong)in_RDI[1] >> 1);
  local_18 = md + local_10;
  libaom_test::MD5::MD5(&local_94,in_RSI,in_RDX,md);
  libaom_test::MD5::MD5((MD5 *)&stack0xfffffffffffffef0,in_RSI,n,md);
  libaom_test::MD5::Add(in_stack_fffffffffffffea0,(uint8_t *)in_stack_fffffffffffffe98,0x52fb4f);
  libaom_test::MD5::Get(in_stack_ffffffffffffff10);
  libaom_test::MD5::Add(in_stack_fffffffffffffea0,(uint8_t *)in_stack_fffffffffffffe98,0x52fb82);
  libaom_test::MD5::Get(in_stack_ffffffffffffff10);
  testing::internal::CmpHelperSTREQ
            ((char *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10->res_,
             in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffed0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffed0);
    this = (AssertHelper *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    testing::AssertionResult::failure_message((AssertionResult *)0x52fbf6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
               in_stack_fffffffffffffebc,in_stack_fffffffffffffeb0);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper(this);
    testing::Message::~Message((Message *)0x52fc42);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x52fca2);
  return;
}

Assistant:

static void compare_fp_stats_md5(aom_fixed_buf_t *fp_stats) {
  // fp_stats consists of 2 set of first pass encoding stats. These 2 set of
  // stats are compared to check if the stats match.
  uint8_t *stats1 = reinterpret_cast<uint8_t *>(fp_stats->buf);
  uint8_t *stats2 = stats1 + fp_stats->sz / 2;
  ::libaom_test::MD5 md5_row_mt_0, md5_row_mt_1;

  md5_row_mt_0.Add(stats1, fp_stats->sz / 2);
  const char *md5_row_mt_0_str = md5_row_mt_0.Get();

  md5_row_mt_1.Add(stats2, fp_stats->sz / 2);
  const char *md5_row_mt_1_str = md5_row_mt_1.Get();

  // Check md5 match.
  ASSERT_STREQ(md5_row_mt_0_str, md5_row_mt_1_str)
      << "MD5 checksums don't match";
}